

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::Extent>::add_blocked_sample
          (TypedTimeSamples<tinyusdz::Extent> *this,double t)

{
  pointer *ppSVar1;
  iterator __position;
  Sample s;
  Sample local_30;
  
  local_30.value.lower._M_elems[0] = INFINITY;
  local_30.value.lower._M_elems[1] = INFINITY;
  local_30.value.lower._M_elems[2] = INFINITY;
  local_30.value.upper._M_elems[0] = -INFINITY;
  local_30.value.upper._M_elems[1] = -INFINITY;
  local_30.value.upper._M_elems[2] = -INFINITY;
  local_30.blocked = true;
  __position._M_current =
       (this->_samples).
       super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_samples).
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_30.t = t;
    ::std::
    vector<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>>
    ::_M_realloc_insert<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample&>
              ((vector<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>>
                *)this,__position,&local_30);
  }
  else {
    *(ulong *)&(__position._M_current)->blocked = CONCAT71(local_30._33_7_,1);
    *(undefined8 *)(((__position._M_current)->value).lower._M_elems + 2) = 0xff8000007f800000;
    ((__position._M_current)->value).upper._M_elems[1] = -INFINITY;
    ((__position._M_current)->value).upper._M_elems[2] = -INFINITY;
    (__position._M_current)->t = t;
    ((__position._M_current)->value).lower._M_elems[0] = INFINITY;
    ((__position._M_current)->value).lower._M_elems[1] = INFINITY;
    ppSVar1 = &(this->_samples).
               super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  this->_dirty = true;
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }